

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createSpecConstantOp
          (Builder *this,Op opCode,Id typeId,Vector<Id> *operands,Vector<unsigned_int> *literals)

{
  bool bVar1;
  Id IVar2;
  Instruction *this_00;
  reference puVar3;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_68;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
  local_60;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
  local_58;
  const_iterator it_1;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
  local_48;
  const_iterator it;
  Instruction *op;
  Vector<unsigned_int> *literals_local;
  Vector<Id> *operands_local;
  Id typeId_local;
  Op opCode_local;
  Builder *this_local;
  
  this_00 = (Instruction *)
            Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,opCode));
  IVar2 = getUniqueId(this);
  Instruction::Instruction(this_00,IVar2,typeId,OpSpecConstantOp);
  Instruction::addImmediateOperand(this_00,opCode);
  local_48._M_current =
       (uint *)std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::cbegin
                         (operands);
  while( true ) {
    it_1 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::cend(operands);
    bVar1 = __gnu_cxx::operator!=(&local_48,&it_1);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
             ::operator*(&local_48);
    Instruction::addIdOperand(this_00,*puVar3);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
    ::operator++(&local_48);
  }
  local_58._M_current =
       (uint *)std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::cbegin
                         (literals);
  while( true ) {
    local_60._M_current =
         (uint *)std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::cend
                           (literals);
    bVar1 = __gnu_cxx::operator!=(&local_58,&local_60);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
             ::operator*(&local_58);
    Instruction::addImmediateOperand(this_00,*puVar3);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
    ::operator++(&local_58);
  }
  Module::mapInstruction(&this->module,this_00);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_68,this_00
            );
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,(value_type *)&local_68);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_68);
  IVar2 = Instruction::getResultId(this_00);
  return IVar2;
}

Assistant:

Id Builder::createSpecConstantOp(Op opCode, Id typeId, const dxil_spv::Vector<Id>& operands, const dxil_spv::Vector<unsigned>& literals)
{
    Instruction* op = new Instruction(getUniqueId(), typeId, OpSpecConstantOp);
    op->addImmediateOperand((unsigned) opCode);
    for (auto it = operands.cbegin(); it != operands.cend(); ++it)
        op->addIdOperand(*it);
    for (auto it = literals.cbegin(); it != literals.cend(); ++it)
        op->addImmediateOperand(*it);
    module.mapInstruction(op);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}